

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask23_16(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0x17 | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] >> 9;
  *puVar1 = in[2] << 0xe | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[2] >> 0x12;
  *puVar1 = in[3] << 5 | *puVar1;
  *puVar1 = in[4] << 0x1c | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[4] >> 4;
  *puVar1 = in[5] << 0x13 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[5] >> 0xd;
  *puVar1 = in[6] << 10 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[6] >> 0x16;
  *puVar1 = in[7] << 1 | *puVar1;
  *puVar1 = in[8] << 0x18 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[8] >> 8;
  *puVar1 = in[9] << 0xf | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[9] >> 0x11;
  *puVar1 = in[10] << 6 | *puVar1;
  *puVar1 = in[0xb] << 0x1d | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[0xb] >> 3;
  *puVar1 = in[0xc] << 0x14 | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[0xc] >> 0xc;
  *puVar1 = in[0xd] << 0xb | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[0xd] >> 0x15;
  *puVar1 = in[0xe] << 2 | *puVar1;
  *puVar1 = in[0xf] << 0x19 | *puVar1;
  out[0xb] = in[0xf] >> 7;
  return out + 0xc;
}

Assistant:

uint32_t *__fastpackwithoutmask23_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (23 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (23 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (23 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (23 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  *out = ((*in)) >> (23 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (23 - 15);
  ++in;
  *out |= ((*in)) << 15;
  ++out;
  *out = ((*in)) >> (23 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (23 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (23 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++out;
  *out = ((*in)) >> (23 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (23 - 16);
  ++in;

  return out + 1;
}